

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_Tt8Cnf(word *t,int nVars,int *pCover)

{
  ulong uVar1;
  int nCubes;
  word tc [4];
  word uRes [4];
  uint local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  word local_48 [5];
  
  local_68 = ~*t;
  local_60 = ~t[1];
  local_58 = ~t[2];
  local_50 = ~t[3];
  local_6c = 0;
  Abc_Tt8IsopCover(t,t,nVars,local_48,pCover,(int *)&local_6c);
  if ((long)(int)local_6c < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      pCover[uVar1] = pCover[uVar1] | 1 << ((char)nVars * '\x02' & 0x1fU);
      uVar1 = uVar1 + 1;
    } while ((long)(int)local_6c != uVar1);
  }
  Abc_Tt8IsopCover(&local_68,&local_68,nVars,local_48,pCover,(int *)&local_6c);
  if ((int)uVar1 < (int)local_6c) {
    uVar1 = uVar1 & 0xffffffff;
    do {
      pCover[uVar1] = pCover[uVar1] | 2 << ((char)nVars * '\x02' & 0x1fU);
      uVar1 = uVar1 + 1;
    } while (local_6c != uVar1);
  }
  if (0x100 < (int)local_6c) {
    __assert_fail("nCubes <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xa14,"int Abc_Tt8Cnf(word *, int, int *)");
  }
  return local_6c;
}

Assistant:

static inline int Abc_Tt8Cnf( word t[4], int nVars, int * pCover )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int c, nCubes = 0;
    Abc_Tt8IsopCover( t,  t,  nVars, uRes, pCover, &nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+0));
    Abc_Tt8IsopCover( tc, tc, nVars, uRes, pCover, &nCubes );
    for ( ; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+1));
    assert( nCubes <= 256 );
    return nCubes;
}